

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddGroupSiftingUp(DdManager *table,int y,int xLow,DD_CHKFP checkFunction,Move **moves)

{
  int y_00;
  uint uVar1;
  DdHalfWord x;
  DdSubtable *pDVar2;
  Move *pMVar3;
  long lVar4;
  DdHalfWord DVar5;
  int iVar6;
  DdHalfWord x_00;
  int iVar7;
  DdHalfWord DVar8;
  int iVar9;
  DdNode *pDVar10;
  Move *pMVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  int local_64;
  int local_60;
  
  y_00 = table->invperm[y];
  uVar14 = y;
  do {
    lVar16 = (long)(int)uVar14;
    uVar1 = table->subtables[lVar16].next;
    bVar17 = uVar14 < uVar1;
    uVar14 = uVar1;
  } while (bVar17);
  local_60 = table->keys - table->isolated;
  lVar12 = (long)xLow;
  local_64 = local_60;
  do {
    lVar4 = lVar12 * 0xe + 0x12;
    do {
      lVar15 = lVar4;
      lVar13 = lVar12;
      if (lVar16 <= lVar13) {
        x_00 = cuddNextLow(table,y);
        goto LAB_0061b3b3;
      }
      iVar7 = table->invperm[lVar13 + 1];
      if (iVar7 == y_00) break;
      iVar6 = cuddTestInteract(table,iVar7,y_00);
      lVar12 = lVar13 + 1;
      lVar4 = lVar15 + 0xe;
    } while (iVar6 == 0);
    local_64 = (local_64 + (uint)(table->vars[iVar7]->ref == 1)) -
               *(int *)((long)&table->subtables->nodelist + lVar15 * 4);
    lVar12 = lVar13 + 1;
  } while( true );
LAB_0061b3b3:
  if (((int)x_00 < xLow) || (local_60 < local_64)) {
    return 1;
  }
  x = table->subtables[(int)x_00].next;
  iVar7 = (*checkFunction)(table,x_00,y);
  pDVar2 = table->subtables;
  if (iVar7 == 0) {
    if ((pDVar2[(int)x_00].next == x_00) && (pDVar2[y].next == y)) {
      iVar7 = table->invperm[(int)x_00];
      iVar6 = cuddSwapInPlace(table,x_00,y);
      if (iVar6 == 0) {
LAB_0061b626:
        pMVar11 = *moves;
        while (pMVar11 != (Move *)0x0) {
          pMVar3 = pMVar11->next;
          pMVar11->y = 0;
          *(DdNode **)&pMVar11->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar3;
          pMVar11 = pMVar3;
        }
        return 0;
      }
      iVar9 = cuddTestInteract(table,iVar7,y_00);
      if (iVar9 != 0) {
        local_64 = (local_64 - (uint)(table->vars[iVar7]->ref == 1)) + table->subtables[y].keys;
      }
      pDVar10 = cuddDynamicAllocNode(table);
      if (pDVar10 == (DdNode *)0x0) goto LAB_0061b626;
      pDVar10->index = x_00;
      pDVar10->ref = y;
      *(undefined4 *)&pDVar10->next = 0;
      *(int *)((long)&pDVar10->next + 4) = iVar6;
      (pDVar10->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar10;
      if ((double)local_60 * table->maxGrowth < (double)iVar6) {
        return 1;
      }
      if (iVar6 < local_60) {
        local_60 = iVar6;
      }
    }
    else {
      iVar7 = ddGroupMove(table,x_00,y,moves);
      if (iVar7 == 0) goto LAB_0061b626;
      uVar14 = (*moves)->y;
      do {
        iVar6 = table->invperm[(int)uVar14];
        iVar9 = cuddTestInteract(table,iVar6,y_00);
        if (iVar9 != 0) {
          local_64 = (local_64 - (uint)(table->vars[iVar6]->ref == 1)) +
                     table->subtables[(int)uVar14].keys;
        }
        uVar14 = table->subtables[(int)uVar14].next;
      } while (uVar14 != (*moves)->y);
      if ((double)local_60 * table->maxGrowth < (double)iVar7) {
        return 1;
      }
      if (iVar7 < local_60) {
        local_60 = iVar7;
      }
    }
  }
  else {
    pDVar2[(int)x_00].next = y;
    DVar5 = pDVar2[y].next;
    do {
      DVar8 = DVar5;
      DVar5 = pDVar2[(int)DVar8].next;
    } while (pDVar2[(int)DVar8].next != y);
    pDVar2[(int)DVar8].next = x;
    pDVar10 = cuddDynamicAllocNode(table);
    if (pDVar10 == (DdNode *)0x0) goto LAB_0061b626;
    pDVar10->index = x_00;
    pDVar10->ref = y;
    *(undefined4 *)&pDVar10->next = 8;
    *(uint *)((long)&pDVar10->next + 4) = table->keys - table->isolated;
    (pDVar10->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar10;
  }
  x_00 = cuddNextLow(table,x);
  y = x;
  goto LAB_0061b3b3;
}

Assistant:

static int
ddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif

    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y's group will not change.
    ** The part of the DD above y that does not interact with any
    ** variable of y's group will not change.
    ** The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    ** What we use here is not really a lower bound, because we ignore
    ** the interactions with all variables except y.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        if (pr > 0 && L != checkL) {
            (void) fprintf(table->out,
                           "Inaccurate lower bound: L = %d checkL = %d\n",
                           L, checkL);
        }
#endif
        gxtop = table->subtables[x].next;
        if (checkFunction(table,x,y)) {
            /* Group found, attach groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = (*moves)->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) (*moves)->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(1);

ddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}